

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O0

void finish(ect *e)

{
  v_array<direction> *pvVar1;
  v_array<v_array<unsigned_int>_> *pvVar2;
  size_t sVar3;
  long in_RDI;
  size_t t;
  size_t l;
  v_array<direction> *this;
  ulong local_18;
  v_array<direction> *local_10;
  
  local_10 = (v_array<direction> *)0x0;
  while( true ) {
    this = local_10;
    pvVar1 = (v_array<direction> *)
             v_array<v_array<v_array<unsigned_int>_>_>::size
                       ((v_array<v_array<v_array<unsigned_int>_>_> *)(in_RDI + 0x38));
    if (pvVar1 <= this) break;
    local_18 = 0;
    while( true ) {
      pvVar2 = v_array<v_array<v_array<unsigned_int>_>_>::operator[]
                         ((v_array<v_array<v_array<unsigned_int>_>_> *)(in_RDI + 0x38),
                          (size_t)local_10);
      sVar3 = v_array<v_array<unsigned_int>_>::size(pvVar2);
      if (sVar3 <= local_18) break;
      pvVar2 = v_array<v_array<v_array<unsigned_int>_>_>::operator[]
                         ((v_array<v_array<v_array<unsigned_int>_>_> *)(in_RDI + 0x38),
                          (size_t)local_10);
      v_array<v_array<unsigned_int>_>::operator[](pvVar2,local_18);
      v_array<unsigned_int>::delete_v((v_array<unsigned_int> *)this);
      local_18 = local_18 + 1;
    }
    v_array<v_array<v_array<unsigned_int>_>_>::operator[]
              ((v_array<v_array<v_array<unsigned_int>_>_> *)(in_RDI + 0x38),(size_t)local_10);
    v_array<v_array<unsigned_int>_>::delete_v((v_array<v_array<unsigned_int>_> *)this);
    local_10 = (v_array<direction> *)((long)&local_10->_begin + 1);
  }
  v_array<v_array<v_array<unsigned_int>_>_>::delete_v
            ((v_array<v_array<v_array<unsigned_int>_>_> *)this);
  v_array<unsigned_int>::delete_v((v_array<unsigned_int> *)this);
  v_array<unsigned_long>::delete_v((v_array<unsigned_long> *)this);
  v_array<direction>::delete_v(this);
  v_array<unsigned_long>::delete_v((v_array<unsigned_long> *)this);
  v_array<bool>::delete_v((v_array<bool> *)this);
  return;
}

Assistant:

void finish(ect& e)
{
  for (size_t l = 0; l < e.all_levels.size(); l++)
  {
    for (size_t t = 0; t < e.all_levels[l].size(); t++) e.all_levels[l][t].delete_v();
    e.all_levels[l].delete_v();
  }
  e.all_levels.delete_v();
  e.final_nodes.delete_v();
  e.up_directions.delete_v();
  e.directions.delete_v();
  e.down_directions.delete_v();
  e.tournaments_won.delete_v();
}